

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

pair<int,_int> __thiscall Board::eliminate(Board *this,Block *block)

{
  byte bVar1;
  int i;
  long lVar2;
  ulong uVar3;
  pair<int,_int> pVar4;
  int count;
  long lVar5;
  long lVar6;
  
  count = 0;
  for (lVar2 = 1; lVar2 != 0x15; lVar2 = lVar2 + 1) {
    if (this->rows[lVar2] == 0xfff) {
      count = count + 1;
    }
    else if (this->rows[lVar2] == 0x801) break;
  }
  if (count == 0) {
    pVar4.first = 0;
    pVar4.second = 0;
    return pVar4;
  }
  uVar3 = 0;
  if (block != (Block *)0x0) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      uVar3 = (ulong)((int)uVar3 +
                     (uint)(this->rows
                            [(long)blockShape[block->t][block->o][lVar2 * 2] + (long)block->x] ==
                           0xfff));
    }
    uVar3 = uVar3 << 0x20;
  }
  lVar5 = 0;
  lVar2 = 0x14;
  while (lVar2 != 0) {
    lVar6 = lVar5;
    if (this->rows[lVar2] == 0xfff) {
      for (; lVar6 != 0; lVar6 = lVar6 + 4) {
        *(undefined4 *)((long)this->rows + lVar6 + 0x50) =
             *(undefined4 *)((long)this->rows + lVar6 + 0x54);
      }
      bVar1 = (byte)lVar2;
      this->rows[0x14] = 0x801;
      for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
        this->cols[lVar6 + 1] =
             (this->cols[lVar6 + 1] >> (bVar1 + 1 & 0x1f)) << (bVar1 & 0x1f) |
             this->cols[lVar6 + 1] & (2 << (bVar1 & 0x1f)) - 1U;
      }
    }
    lVar5 = lVar5 + -4;
    lVar2 = lVar2 + -1;
  }
  return (pair<int,_int>)(uVar3 | (uint)count);
}

Assistant:

std::pair<int, int> Board::eliminate(const Block *block){
    int count = 0;
    for (int i = 1; i <= MAPHEIGHT; ++i) 
        if (rows[i] == EMPTY_ROW) break;
            else if (rows[i] == FULL_ROW)
                ++count;

    if (count == 0)
        return std::make_pair(0, 0);
    int count2 = 0;
    if (block) {
        auto shape = blockShape[block->t][block->o];
        for (int i = 0; i < 4; ++i)
            if (rows[block->x + shape[2 * i]] == FULL_ROW)
                ++count2;
    }

    for (int i = MAPHEIGHT; i > 0; --i)
        if (rows[i] == FULL_ROW){
            for (int j = i; j < MAPHEIGHT; ++j)
                rows[j] = rows[j + 1];
            rows[MAPHEIGHT] = EMPTY_ROW;
            for (int j = 1; j <= MAPWIDTH; ++j)
                cols[j] = (cols[j] & ((1 << (i + 1)) - 1)) |
                          ((cols[j] >> (i + 1)) << i);
        }
     
    return std::make_pair(count, count2);
}